

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void grayscale_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                      JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  int iVar2;
  JSAMPROW pJVar3;
  JSAMPIMAGE pppJVar4;
  int instride;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  int num_rows_local;
  JDIMENSION output_row_local;
  JSAMPIMAGE output_buf_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  
  uVar1 = cinfo->image_width;
  iVar2 = cinfo->input_components;
  inptr._0_4_ = num_rows;
  inptr._4_4_ = output_row;
  output_buf_local = (JSAMPIMAGE)input_buf;
  while (inptr._0_4_ = (int)inptr + -1, -1 < (int)inptr) {
    pppJVar4 = output_buf_local + 1;
    outptr = (JSAMPROW)*output_buf_local;
    pJVar3 = (*output_buf)[inptr._4_4_];
    inptr._4_4_ = inptr._4_4_ + 1;
    for (instride = 0; output_buf_local = pppJVar4, (uint)instride < uVar1; instride = instride + 1)
    {
      pJVar3[(uint)instride] = *outptr;
      outptr = outptr + iVar2;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
grayscale_convert (j_compress_ptr cinfo,
		   JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
		   JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;
  int instride = cinfo->input_components;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr = output_buf[0][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      outptr[col] = inptr[0];	/* don't need GETJSAMPLE() here */
      inptr += instride;
    }
  }
}